

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O1

void xercesc_4_0::XMLBigDecimal::parseDecimal(XMLCh *toParse,MemoryManager *manager)

{
  XMLCh *pXVar1;
  short *psVar2;
  ushort uVar3;
  XMLCh *pXVar4;
  NumberFormatException *this;
  XMLCh *pXVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar8 = -2;
  do {
    lVar7 = lVar8;
    uVar3 = *(ushort *)((long)toParse + lVar7 + 2);
    lVar8 = lVar7 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar3] < '\0');
  if (uVar3 == 0) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0x143,XMLNUM_WSString,manager);
LAB_0025147d:
    __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  lVar9 = 0;
  if (toParse != (XMLCh *)0x0) {
    do {
      psVar2 = (short *)((long)toParse + lVar9);
      lVar9 = lVar9 + 2;
    } while (*psVar2 != 0);
    lVar9 = (lVar9 >> 1) + -1;
  }
  pXVar4 = toParse + lVar9 + 1;
  lVar9 = lVar8 + lVar9 * -2;
  do {
    pXVar5 = pXVar4 + -2;
    pXVar4 = pXVar4 + -1;
    lVar9 = lVar9 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar5] < '\0');
  if (uVar3 == 0x2b) {
    if (lVar9 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0x15a,XMLNUM_Inv_chars,manager);
      goto LAB_0025147d;
    }
  }
  else {
    if (uVar3 != 0x2d) goto LAB_0025140c;
    if (lVar9 == 0) {
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0x152,XMLNUM_Inv_chars,manager);
      goto LAB_0025147d;
    }
  }
  lVar8 = lVar7 + 4;
LAB_0025140c:
  pXVar5 = (XMLCh *)((long)toParse + lVar8 + -2);
  do {
    pXVar1 = pXVar5 + 1;
    pXVar5 = pXVar5 + 1;
  } while (*pXVar1 == L'0');
  if (pXVar5 < pXVar4) {
    bVar6 = false;
    do {
      if (*pXVar5 == L'.') {
        if (bVar6) {
          this = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                     ,0x176,XMLNUM_2ManyDecPoint,manager);
          goto LAB_0025147d;
        }
        bVar6 = true;
      }
      else if ((ushort)(*pXVar5 + L'ￆ') < 0xfff6) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0x17b,XMLNUM_Inv_chars,manager);
        goto LAB_0025147d;
      }
      pXVar5 = pXVar5 + 1;
    } while (pXVar5 < pXVar4);
  }
  return;
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh*         const toParse
                               ,        MemoryManager* const manager)
{

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string

    if (*startPtr == chDash)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        return;
    }

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        startPtr++;

    }

    return;
}